

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PClassPointer::IsMatch(PClassPointer *this,intptr_t id1,intptr_t id2)

{
  PClass *pPVar1;
  undefined8 uVar2;
  PClass *pPVar3;
  bool bVar4;
  
  pPVar1 = PClass::RegistrationInfo.MyClass;
  if (*(long *)(id1 + 8) == 0) {
    uVar2 = (*(code *)**(undefined8 **)id1)(id1);
    *(undefined8 *)(id1 + 8) = uVar2;
  }
  pPVar3 = *(PClass **)(id1 + 8);
  bVar4 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar4) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar4 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (bVar4) {
    return this->ClassRestriction == (PClass *)id2;
  }
  __assert_fail("pointat->IsKindOf(RUNTIME_CLASS(PClass))",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0x79e,"virtual bool PClassPointer::IsMatch(intptr_t, intptr_t) const");
}

Assistant:

bool PClassPointer::IsMatch(intptr_t id1, intptr_t id2) const
{
	const PType *pointat = (const PType *)id1;
	const PClass *classat = (const PClass *)id2;

	assert(pointat->IsKindOf(RUNTIME_CLASS(PClass)));
	return classat == ClassRestriction;
}